

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_move_16_al_ai(void)

{
  uint value;
  uint address;
  uint ea;
  uint res;
  
  value = OPER_AY_AI_16();
  address = m68ki_read_imm_32();
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_16_al_ai(void)
{
	uint res = OPER_AY_AI_16();
	uint ea = EA_AL_16();

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}